

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O3

p_ply ply_open_from_file(FILE *fp,p_ply_error_cb error_cb,long idata,void *pdata)

{
  p_ply ptVar1;
  code *pcVar2;
  
  pcVar2 = ply_error_cb;
  if (error_cb != (p_ply_error_cb)0x0) {
    pcVar2 = error_cb;
  }
  if (fp != (FILE *)0x0) {
    ptVar1 = (p_ply)calloc(1,0x20f0);
    if (ptVar1 == (p_ply)0x0) {
      (*pcVar2)((p_ply)0x0,"Out of memory");
    }
    else {
      ptVar1->idata = idata;
      ptVar1->pdata = pdata;
      ptVar1->error_cb = pcVar2;
      ptVar1->fp = fp;
    }
    return ptVar1;
  }
  __assert_fail("fp",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                ,0x17c,"p_ply ply_open_from_file(FILE *, p_ply_error_cb, long, void *)");
}

Assistant:

p_ply ply_open_from_file(FILE *fp, p_ply_error_cb error_cb,
        long idata, void *pdata) {
    p_ply ply = NULL;
    if (error_cb == NULL) error_cb = ply_error_cb;
    assert(fp);
    if (!ply_type_check()) {
        error_cb(ply, "Incompatible type system");
        return NULL;
    }
    ply = ply_alloc();
    if (!ply) {
        error_cb(NULL, "Out of memory");
        return NULL;
    }
    ply->idata = idata;
    ply->pdata = pdata;
    ply->io_mode = PLY_READ;
    ply->error_cb = error_cb;
    ply->fp = fp;
    ply->own_fp = 0;
    return ply;
}